

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O1

void __thiscall script_p2sh_tests::is::test_method(is *this)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  void *pvVar4;
  bool bVar5;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar6;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  initializer_list<unsigned_char> __l;
  const_string file_00;
  initializer_list<unsigned_char> __l_00;
  const_string file_01;
  initializer_list<unsigned_char> __l_01;
  const_string file_02;
  initializer_list<unsigned_char> __l_02;
  const_string file_03;
  const_string file_04;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file_05;
  span<const_std::byte,_18446744073709551615UL> b_02;
  const_string file_06;
  span<const_std::byte,_18446744073709551615UL> b_03;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> direct;
  CScript not_p2sh;
  CScript p2sh;
  uint160 dummy;
  check_type cVar10;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  assertion_result local_210;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  assertion_result local_1c8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  assertion_result local_180;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  assertion_result local_138;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_120;
  assertion_result local_118;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 local_98 [24];
  undefined8 uStack_80;
  undefined1 local_78 [28];
  uint uStack_5c;
  uchar local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_78._16_8_ = 0;
  stack0xffffffffffffffa0 = 0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = 0;
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_98[0] = 0xa9;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78,(iterator)local_78,
             local_98);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_98,local_58,
             local_58 + 0x14,(allocator_type *)&local_138);
  b._M_extent._M_extent_value = local_98._8_8_ - local_98._0_8_;
  b._M_ptr = (pointer)local_98._0_8_;
  ppVar6 = &CScript::operator<<((CScript *)local_78,b)->super_CScriptBase;
  uVar1 = ppVar6->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar7 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar6->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar7 = ppVar6;
  }
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x87;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar7->_union + (long)(int)uVar2),(uchar *)&local_138);
  if ((_func_int **)local_98._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ - local_98._0_8_);
  }
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xe0;
  file.m_begin = (iterator)&local_a8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b8,msg);
  bVar5 = CScript::IsPayToScriptHash((CScript *)local_78);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar5;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  uStack_80 = &local_e0;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "p2sh.IsPayToScriptHash()";
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_98._8_8_ = local_98._8_8_ & 0xffffffffffffff00;
  local_98._0_8_ = &PTR__lazy_ostream_013abc70;
  local_98._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_c0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_98,1,0,WARN,_cVar10,(size_t)&local_c8,0xe0);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_98._0_2_ = 0x14a9;
  __l._M_len = 2;
  __l._M_array = local_98;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_e0,__l,(allocator_type *)&local_138);
  local_98._0_8_ = local_98._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            (&local_e0,
             (iterator)
             local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,0x14,local_98);
  local_98[0] = 0x87;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_e0,local_98);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xe5;
  file_00.m_begin = (iterator)&local_f0;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
             msg_00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CScript::IsPayToScriptHash((CScript *)local_98);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)&local_180;
  local_180._0_8_ = "CScript(direct.begin(), direct.end()).IsPayToScriptHash()";
  local_180.m_message.px = (element_type *)0xec58a6;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013abc70;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_140 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&local_138,1,0,WARN,_cVar10,(size_t)&local_148,0xe5);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  if (0x1c < uStack_80._4_4_) {
    free((void *)local_98._0_8_);
    local_98._0_8_ = (_func_int **)0x0;
  }
  local_98._0_3_ = 0x144ca9;
  __l_00._M_len = 3;
  __l_00._M_array = local_98;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,__l_00,
             (allocator_type *)&local_138);
  local_98._0_8_ = local_98._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,
             (iterator)local_118.m_message.px,0x14,local_98);
  local_98[0] = 0x87;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,local_98);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xeb;
  file_01.m_begin = (iterator)&local_158;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_168,
             msg_01);
  first._M_current._1_7_ = local_118._1_7_;
  first._M_current._0_1_ =
       local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,first,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_118.m_message.px);
  bVar5 = CScript::IsPayToScriptHash((CScript *)local_98);
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar5;
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)&local_1c8;
  local_1c8._0_8_ = "!CScript(pushdata1.begin(), pushdata1.end()).IsPayToScriptHash()";
  local_1c8.m_message.px = (element_type *)0xec58e7;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013abc70;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_188 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)&local_138,1,0,WARN,_cVar10,(size_t)&local_190,0xeb);
  boost::detail::shared_count::~shared_count((shared_count *)&local_180.m_message.pn);
  if (0x1c < uStack_80._4_4_) {
    free((void *)local_98._0_8_);
    local_98._0_8_ = (_func_int **)0x0;
  }
  local_98._0_4_ = 0x144da9;
  __l_01._M_len = 4;
  __l_01._M_array = local_98;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180,__l_01,
             (allocator_type *)&local_138);
  local_98._0_8_ = local_98._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180,
             (iterator)local_180.m_message.px,0x14,local_98);
  local_98[0] = 0x87;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180,local_98);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xef;
  file_02.m_begin = (iterator)&local_1a0;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b0,
             msg_02);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_180._0_8_,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_180.m_message.px);
  bVar5 = CScript::IsPayToScriptHash((CScript *)local_98);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar5;
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)&local_210;
  local_210._0_8_ = "!CScript(pushdata2.begin(), pushdata2.end()).IsPayToScriptHash()";
  local_210.m_message.px = (element_type *)0xec5928;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013abc70;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1d0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)&local_138,1,0,WARN,_cVar10,(size_t)&local_1d8,0xef);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1c8.m_message.pn);
  if (0x1c < uStack_80._4_4_) {
    free((void *)local_98._0_8_);
    local_98._0_8_ = (_func_int **)0x0;
  }
  local_98._0_6_ = 0x144ea9;
  __l_02._M_len = 6;
  __l_02._M_array = local_98;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,__l_02,
             (allocator_type *)&local_138);
  local_98._0_8_ = local_98._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,
             (iterator)local_1c8.m_message.px,0x14,local_98);
  local_98[0] = 0x87;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,local_98);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xf3;
  file_03.m_begin = (iterator)&local_1e8;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f8,
             msg_03);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_1c8._0_8_,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_1c8.m_message.px);
  bVar5 = CScript::IsPayToScriptHash((CScript *)local_98);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar5;
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = "!CScript(pushdata4.begin(), pushdata4.end()).IsPayToScriptHash()";
  local_218 = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013abc70;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_228 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_120 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)&local_220;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_138,1,0,WARN,_cVar10,(size_t)&local_230,0xf3);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  if (0x1c < uStack_80._4_4_) {
    free((void *)local_98._0_8_);
  }
  local_98._16_8_ = 0;
  uStack_80 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  local_98._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
  local_98._8_8_ = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xf6;
  file_04.m_begin = (iterator)&local_240;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_250,
             msg_04);
  bVar5 = CScript::IsPayToScriptHash((CScript *)local_98);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar5;
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = "!not_p2sh.IsPayToScriptHash()";
  local_218 = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013abc70;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_258 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_120 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)&local_220;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_138,1,0,WARN,_cVar10,(size_t)&local_260,0xf6);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,0);
  sVar3 = uStack_80._4_4_ - 0x1d;
  if (uStack_80._4_4_ < 0x1d) {
    sVar3 = uStack_80._4_4_;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,sVar3);
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98._0_8_;
  uVar1 = uStack_80._4_4_ - 0x1d;
  if (uStack_80._4_4_ < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98;
    uVar1 = uStack_80._4_4_;
  }
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xa9;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar1),(uchar *)&local_138);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_138,local_58,
             local_58 + 0x14,(allocator_type *)&local_210);
  b_00._M_extent._M_extent_value = (long)local_138.m_message.px - local_138._0_8_;
  b_00._M_ptr = (pointer)local_138._0_8_;
  this_00 = CScript::operator<<((CScript *)local_98,b_00);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_210,local_58,
             local_58 + 0x14,(allocator_type *)&local_220);
  b_01._M_extent._M_extent_value = (long)local_210.m_message.px - local_210._0_8_;
  b_01._M_ptr = (pointer)local_210._0_8_;
  ppVar6 = &CScript::operator<<(this_00,b_01)->super_CScriptBase;
  uVar1 = ppVar6->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar7 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar6->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar7 = ppVar6;
  }
  local_220 = (char *)CONCAT71(local_220._1_7_,0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar7->_union + (long)(int)uVar2),(uchar *)&local_220);
  if ((pointer)local_210._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_210._0_8_,(long)local_210.m_message.pn.pi_ - local_210._0_8_);
  }
  if ((_func_int **)local_138._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_138._0_8_,(long)local_138.m_message.pn.pi_ - local_138._0_8_);
  }
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xf9;
  file_05.m_begin = (iterator)&local_270;
  msg_05.m_end = pvVar9;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_280,
             msg_05);
  bVar5 = CScript::IsPayToScriptHash((CScript *)local_98);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = "!not_p2sh.IsPayToScriptHash()";
  local_218 = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013abc70;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_288 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_120 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)&local_220;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar5;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_138,1,0,WARN,_cVar10,(size_t)&local_290,0xf9);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,0);
  sVar3 = uStack_80._4_4_ - 0x1d;
  if (uStack_80._4_4_ < 0x1d) {
    sVar3 = uStack_80._4_4_;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,sVar3);
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98._0_8_;
  uVar1 = uStack_80._4_4_ - 0x1d;
  if (uStack_80._4_4_ < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98;
    uVar1 = uStack_80._4_4_;
  }
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x61;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar1),(uchar *)&local_138);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_138,local_58,
             local_58 + 0x14,(allocator_type *)&local_210);
  b_02._M_extent._M_extent_value = (long)local_138.m_message.px - local_138._0_8_;
  b_02._M_ptr = (pointer)local_138._0_8_;
  ppVar6 = &CScript::operator<<((CScript *)local_98,b_02)->super_CScriptBase;
  uVar1 = ppVar6->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar7 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar6->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar7 = ppVar6;
  }
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x87;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar7->_union + (long)(int)uVar2),(uchar *)&local_210);
  if ((_func_int **)local_138._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_138._0_8_,(long)local_138.m_message.pn.pi_ - local_138._0_8_);
  }
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xfc;
  file_06.m_begin = (iterator)&local_2a0;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2b0,
             msg_06);
  bVar5 = CScript::IsPayToScriptHash((CScript *)local_98);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = "!not_p2sh.IsPayToScriptHash()";
  local_218 = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013abc70;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_2b8 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_120 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)&local_220;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar5;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_138,1,0,WARN,_cVar10,(size_t)&local_2c0,0xfc);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,0);
  sVar3 = uStack_80._4_4_ - 0x1d;
  if (uStack_80._4_4_ < 0x1d) {
    sVar3 = uStack_80._4_4_;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,sVar3);
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98._0_8_;
  uVar1 = uStack_80._4_4_ - 0x1d;
  if (uStack_80._4_4_ < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98;
    uVar1 = uStack_80._4_4_;
  }
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xa9;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar1),(uchar *)&local_138);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_138,local_58,
             local_58 + 0x14,(allocator_type *)&local_210);
  b_03._M_extent._M_extent_value = (long)local_138.m_message.px - local_138._0_8_;
  b_03._M_ptr = (pointer)local_138._0_8_;
  ppVar6 = &CScript::operator<<((CScript *)local_98,b_03)->super_CScriptBase;
  uVar1 = ppVar6->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar7 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar6->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar7 = ppVar6;
  }
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar7->_union + (long)(int)uVar2),(uchar *)&local_210);
  if ((_func_int **)local_138._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_138._0_8_,(long)local_138.m_message.pn.pi_ - local_138._0_8_);
  }
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xff;
  file_07.m_begin = (iterator)&local_2d0;
  msg_07.m_end = pvVar9;
  msg_07.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2e0,
             msg_07);
  bVar5 = CScript::IsPayToScriptHash((CScript *)local_98);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar5;
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = "!not_p2sh.IsPayToScriptHash()";
  local_218 = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013abc70;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_120 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)&local_220;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_138,1,0,WARN,0xec56eb,
             (size_t)&stack0xfffffffffffffd10,0xff);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  if (0x1c < uStack_80._4_4_) {
    free((void *)local_98._0_8_);
    local_98._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
  }
  if ((uchar *)local_1c8._0_8_ != (uchar *)0x0) {
    operator_delete((void *)local_1c8._0_8_,(long)local_1c8.m_message.pn.pi_ - local_1c8._0_8_);
  }
  if ((uchar *)local_180._0_8_ != (uchar *)0x0) {
    operator_delete((void *)local_180._0_8_,(long)local_180.m_message.pn.pi_ - local_180._0_8_);
  }
  pvVar4 = (void *)CONCAT71(local_118._1_7_,
                            local_118.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_118.m_message.pn.pi_ - (long)pvVar4);
  }
  if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (0x1c < uStack_5c) {
    free((void *)local_78._0_8_);
    local_78._0_8_ = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(is)
{
    // Test CScript::IsPayToScriptHash()
    uint160 dummy;
    CScript p2sh;
    p2sh << OP_HASH160 << ToByteVector(dummy) << OP_EQUAL;
    BOOST_CHECK(p2sh.IsPayToScriptHash());

    std::vector<unsigned char> direct = {OP_HASH160, 20};
    direct.insert(direct.end(), 20, 0);
    direct.push_back(OP_EQUAL);
    BOOST_CHECK(CScript(direct.begin(), direct.end()).IsPayToScriptHash());

    // Not considered pay-to-script-hash if using one of the OP_PUSHDATA opcodes:
    std::vector<unsigned char> pushdata1 = {OP_HASH160, OP_PUSHDATA1, 20};
    pushdata1.insert(pushdata1.end(), 20, 0);
    pushdata1.push_back(OP_EQUAL);
    BOOST_CHECK(!CScript(pushdata1.begin(), pushdata1.end()).IsPayToScriptHash());
    std::vector<unsigned char> pushdata2 = {OP_HASH160, OP_PUSHDATA2, 20, 0};
    pushdata2.insert(pushdata2.end(), 20, 0);
    pushdata2.push_back(OP_EQUAL);
    BOOST_CHECK(!CScript(pushdata2.begin(), pushdata2.end()).IsPayToScriptHash());
    std::vector<unsigned char> pushdata4 = {OP_HASH160, OP_PUSHDATA4, 20, 0, 0, 0};
    pushdata4.insert(pushdata4.end(), 20, 0);
    pushdata4.push_back(OP_EQUAL);
    BOOST_CHECK(!CScript(pushdata4.begin(), pushdata4.end()).IsPayToScriptHash());

    CScript not_p2sh;
    BOOST_CHECK(!not_p2sh.IsPayToScriptHash());

    not_p2sh.clear(); not_p2sh << OP_HASH160 << ToByteVector(dummy) << ToByteVector(dummy) << OP_EQUAL;
    BOOST_CHECK(!not_p2sh.IsPayToScriptHash());

    not_p2sh.clear(); not_p2sh << OP_NOP << ToByteVector(dummy) << OP_EQUAL;
    BOOST_CHECK(!not_p2sh.IsPayToScriptHash());

    not_p2sh.clear(); not_p2sh << OP_HASH160 << ToByteVector(dummy) << OP_CHECKSIG;
    BOOST_CHECK(!not_p2sh.IsPayToScriptHash());
}